

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

bool is_operator(Token *token)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = token->kind - LE_EQ;
  bVar1 = 0;
  if (uVar2 < 0x18) {
    bVar1 = *(bool *)(&DAT_00106274 + (ulong)uVar2 * 4);
  }
  return bVar1;
}

Assistant:

bool is_operator(Token *token) {
    switch (token->kind) {
        case ADD2:
        case SUB2:
        case BIG_EQ:
        case LE_EQ:
        case DIV_EQ:
        case SUB_EQ:
        case MUL_EQ:
        case MOD_EQ:
        case OR_EQ:
        case EM_EQ:
        case ADD_EQ:
        case AND_EQ:
        case XOR_EQ:
            return true;
        default:
            return false;
    }
}